

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

OASIS_FLOAT __thiscall gulcalc::getgul(gulcalc *this,damagebindictionary *b,gulGulSamples *g)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  OASIS_FLOAT OVar6;
  float fVar7;
  double dVar8;
  
  fVar1 = b->bin_from;
  fVar7 = b->bin_to;
  if ((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) {
    fVar2 = g->prob_from;
    fVar7 = fVar7 - fVar1;
    dVar4 = (double)((g->bin_mean - fVar1) / fVar7);
    dVar3 = round(dVar4 * 100000.0);
    if ((int)dVar3 == 50000) {
      dVar3 = (double)fVar7 * ((g->rval - (double)fVar2) / (double)(g->prob_to - fVar2)) +
              (double)fVar1;
    }
    else {
      dVar3 = (double)fVar7;
      dVar5 = (double)(g->prob_to - fVar2);
      dVar8 = (dVar4 + dVar4 + -1.0) * ((dVar5 * 3.0) / (dVar3 * dVar3));
      dVar4 = (dVar4 * -3.0 + 2.0) * ((dVar5 + dVar5) / dVar3);
      dVar3 = dVar4 * dVar4 + dVar8 * -4.0 * ((double)fVar2 - g->rval);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = (dVar3 - dVar4) / (dVar8 + dVar8) + (double)fVar1;
    }
    OVar6 = (OASIS_FLOAT)((double)g->tiv * dVar3);
  }
  else {
    OVar6 = fVar7 * g->tiv;
  }
  return OVar6;
}

Assistant:

OASIS_FLOAT gulcalc::getgul(damagebindictionary &b, gulGulSamples &g)
{
	OASIS_FLOAT gul = 0;
	if (b.bin_from == b.bin_to) {
		gul = b.bin_to * g.tiv;
		return gul;
	}

	double x = (g.bin_mean - b.bin_from) / (b.bin_to - b.bin_from);
	int z = (int) (round(x * 100000));
	if (z == 50000) {
		gul = (b.bin_from + ((g.rval - g.prob_from) / (g.prob_to - g.prob_from) * (b.bin_to - b.bin_from))) * g.tiv;
		return gul;
	}

	double bin_width = b.bin_to - b.bin_from;
	double bin_height = g.prob_to - g.prob_from;

	double aa = (3 * bin_height / (bin_width * bin_width)) * ((2 * x) - 1);

	double bb = (2 * bin_height / bin_width) * (2 - (3* x)) ;

	double cc = g.prob_from - g.rval;
	gul = (b.bin_from + (sqrt(bb*bb - (4 * aa*cc)) - bb) / (2 * aa)) * g.tiv;

	return gul;
}